

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O1

void __thiscall r_exec::PGMController::PGMController(PGMController *this,View *ipgm_view)

{
  atomic_int_fast64_t *paVar1;
  PGMOverlay *this_00;
  P<r_exec::Overlay> local_20;
  
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__InputLessPGMController_001c0f08;
  this_00 = (PGMOverlay *)operator_new(0xe8);
  PGMOverlay::PGMOverlay(this_00,(Controller *)this);
  LOCK();
  paVar1 = &(this_00->super_InputLessPGMOverlay).super_Overlay.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_20.object = (_Object *)this_00;
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  if ((PGMOverlay *)local_20.object != (PGMOverlay *)0x0) {
    LOCK();
    ((local_20.object)->refCount).super___atomic_base<long>._M_i =
         ((local_20.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_20.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((InputLessPGMOverlay *)&(local_20.object)->_vptr__Object)->super_Overlay).super__Object.
        _vptr__Object[1])();
    }
  }
  return;
}

Assistant:

PGMController::PGMController(r_code::View *ipgm_view): _PGMController(ipgm_view)
{
    overlays.push_back(new PGMOverlay(this));
}